

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void ft_var_to_normalized(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Fixed *normalized)

{
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  long lVar3;
  GX_AVarTable pGVar4;
  GX_AVarCorrespondence pGVar5;
  FT_UInt *pFVar6;
  uint uVar7;
  FT_ItemVarDelta FVar8;
  FT_Long FVar9;
  FT_Pointer P;
  long lVar10;
  FT_UInt outerIndex;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  GX_AVarSegment pGVar14;
  FT_UInt innerIndex;
  FT_Fixed *pFVar15;
  GX_AVarTable table;
  ulong uVar16;
  FT_Error error;
  FT_Memory local_40;
  FT_Fixed *local_38;
  
  error = 0;
  pGVar1 = face->blend;
  pFVar2 = pGVar1->mmvar;
  if (pFVar2->num_axis < num_coords) {
    num_coords = pFVar2->num_axis;
  }
  uVar13 = (ulong)num_coords;
  local_40 = (face->root).memory;
  pFVar15 = &pFVar2->axis->maximum;
  uVar16 = 0;
  do {
    if (uVar13 == uVar16) {
      uVar7 = pFVar2->num_axis;
      uVar16 = (ulong)uVar7;
      for (; uVar13 < uVar16; uVar13 = uVar13 + 1) {
        normalized[uVar13] = 0;
      }
      pGVar4 = pGVar1->avar_table;
      if (pGVar4 != (GX_AVarTable)0x0) {
        pGVar14 = pGVar4->avar_segment;
        if (pGVar14 != (GX_AVarSegment)0x0) {
          for (uVar13 = 0; uVar7 = (uint)uVar16, uVar13 < uVar16; uVar13 = uVar13 + 1) {
            lVar11 = 0;
            for (uVar12 = 1; uVar12 < pGVar14->pairCount; uVar12 = uVar12 + 1) {
              pGVar5 = pGVar14->correspondence;
              lVar3 = *(long *)((long)&pGVar5[1].fromCoord + lVar11);
              if (normalized[uVar13] < lVar3) {
                lVar10 = *(long *)((long)&pGVar5->fromCoord + lVar11);
                FVar9 = FT_MulDiv(normalized[uVar13] - lVar10,
                                  *(long *)((long)&pGVar5[1].toCoord + lVar11) -
                                  *(long *)((long)&pGVar5->toCoord + lVar11),lVar3 - lVar10);
                normalized[uVar13] =
                     FVar9 + *(long *)((long)&pGVar14->correspondence->toCoord + lVar11);
                uVar16 = (ulong)pFVar2->num_axis;
                break;
              }
              lVar11 = lVar11 + 0x10;
            }
            pGVar14 = pGVar14 + 1;
          }
        }
        if ((pGVar4->itemStore).varData != (GX_ItemVarData)0x0) {
          P = ft_mem_qrealloc(local_40,8,0,(ulong)uVar7,(void *)0x0,&error);
          if (error == 0) {
            local_38 = face->blend->normalizedcoords;
            face->blend->normalizedcoords = normalized;
            for (uVar13 = 0; uVar7 = pFVar2->num_axis, uVar13 < uVar7; uVar13 = uVar13 + 1) {
              pFVar6 = (pGVar4->axisMap).innerIndex;
              if (pFVar6 == (FT_UInt *)0x0) {
                outerIndex = 0;
                innerIndex = (FT_UInt)uVar13;
              }
              else {
                uVar16 = (pGVar4->axisMap).mapCount;
                uVar12 = (ulong)((int)uVar16 - 1);
                if (uVar13 < uVar16) {
                  uVar12 = uVar13;
                }
                outerIndex = (pGVar4->axisMap).outerIndex[uVar12 & 0xffffffff];
                innerIndex = pFVar6[uVar12 & 0xffffffff];
              }
              lVar11 = normalized[uVar13];
              FVar8 = tt_var_get_item_delta(face,&pGVar4->itemStore,outerIndex,innerIndex);
              lVar11 = (FVar8 << 2) + lVar11;
              if (0xffff < lVar11) {
                lVar11 = 0x10000;
              }
              if (lVar11 < -0xffff) {
                lVar11 = -0x10000;
              }
              *(long *)((long)P + uVar13 * 8) = lVar11;
            }
            for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
              normalized[uVar13] = *(FT_Fixed *)((long)P + uVar13 * 8);
            }
            face->blend->normalizedcoords = local_38;
            ft_mem_free(local_40,P);
          }
        }
      }
      return;
    }
    lVar11 = coords[uVar16];
    lVar3 = pFVar15[-1];
    if (lVar11 - lVar3 == 0 || lVar11 < lVar3) {
      if (lVar11 < lVar3) {
        FVar9 = -0x10000;
        if (pFVar15[-2] < lVar11) {
          lVar10 = lVar3 - pFVar15[-2];
          goto LAB_00217e74;
        }
      }
      else {
        FVar9 = 0;
      }
    }
    else {
      FVar9 = 0x10000;
      if (lVar11 < *pFVar15) {
        lVar10 = *pFVar15 - lVar3;
LAB_00217e74:
        FVar9 = FT_DivFix(lVar11 - lVar3,lVar10);
      }
    }
    normalized[uVar16] = FVar9;
    uVar16 = uVar16 + 1;
    pFVar15 = pFVar15 + 6;
  } while( true );
}

Assistant:

static void
  ft_var_to_normalized( TT_Face    face,
                        FT_UInt    num_coords,
                        FT_Fixed*  coords,
                        FT_Fixed*  normalized )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = face->root.memory;
    FT_UInt    i, j;

    GX_Blend        blend;
    FT_MM_Var*      mmvar;
    FT_Var_Axis*    a;
    GX_AVarSegment  av;

    FT_Fixed*  new_normalized = NULL;
    FT_Fixed*  old_normalized;


    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_to_normalized:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    /* Axis normalization is a two-stage process.  First we normalize */
    /* based on the [min,def,max] values for the axis to be [-1,0,1]. */
    /* Then, if there's an `avar' table, we renormalize this range.   */

    a = mmvar->axis;
    for ( i = 0; i < num_coords; i++, a++ )
    {
      FT_Fixed  coord = coords[i];


      FT_TRACE5(( "    %d: %.5f\n", i, (double)coord / 65536 ));
      if ( coord > a->maximum || coord < a->minimum )
      {
        FT_TRACE1(( "ft_var_to_normalized: design coordinate %.5f\n",
                    (double)coord / 65536 ));
        FT_TRACE1(( "                      is out of range [%.5f;%.5f];"
                    " clamping\n",
                    (double)a->minimum / 65536,
                    (double)a->maximum / 65536 ));
      }

      if ( coord > a->def )
        normalized[i] = coord >= a->maximum ?  0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->maximum, a->def ) );
      else if ( coord < a->def )
        normalized[i] = coord <= a->minimum ? -0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->def, a->minimum ) );
      else
        normalized[i] = 0;
    }

    FT_TRACE5(( "\n" ));

    for ( ; i < mmvar->num_axis; i++ )
      normalized[i] = 0;

    if ( blend->avar_table )
    {
      GX_AVarTable  table = blend->avar_table;


      FT_TRACE5(( "normalized design coordinates"
                  " before applying `avar' data:\n" ));

      if ( table->avar_segment )
      {
        av = table->avar_segment;

        for ( i = 0; i < mmvar->num_axis; i++, av++ )
        {
          for ( j = 1; j < (FT_UInt)av->pairCount; j++ )
          {
            if ( normalized[i] < av->correspondence[j].fromCoord )
            {
              FT_TRACE5(( "  %.5f\n", (double)normalized[i] / 65536 ));

              normalized[i] =
                FT_MulDiv( normalized[i] - av->correspondence[j - 1].fromCoord,
                           av->correspondence[j].toCoord -
                             av->correspondence[j - 1].toCoord,
                           av->correspondence[j].fromCoord -
                             av->correspondence[j - 1].fromCoord ) +
                av->correspondence[j - 1].toCoord;
              break;
            }
          }
        }
      }

      if ( table->itemStore.varData )
      {
        if ( FT_QNEW_ARRAY( new_normalized, mmvar->num_axis ) )
          return;

        /* Install our half-normalized coordinates for the next */
        /* Item Variation Store to work with.                   */
        old_normalized                = face->blend->normalizedcoords;
        face->blend->normalizedcoords = normalized;

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          FT_Fixed  v          = normalized[i];
          FT_UInt   innerIndex = i;
          FT_UInt   outerIndex = 0;
          FT_Int    delta;


          if ( table->axisMap.innerIndex )
          {
            FT_UInt  idx = i;


            if ( idx >= table->axisMap.mapCount )
              idx = table->axisMap.mapCount - 1;

            outerIndex = table->axisMap.outerIndex[idx];
            innerIndex = table->axisMap.innerIndex[idx];
          }

          delta = tt_var_get_item_delta( face,
                                         &table->itemStore,
                                         outerIndex,
                                         innerIndex );

	  v += delta << 2;

	  /* Clamp value range. */
	  v = v >=  0x10000L ?  0x10000 : v;
	  v = v <= -0x10000L ? -0x10000 : v;

          new_normalized[i] = v;
        }

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          normalized[i] = new_normalized[i];
        }

        face->blend->normalizedcoords = old_normalized;

        FT_FREE( new_normalized );
      }
    }
  }